

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O2

int Cec_ManCountNonConstOutputs(Gia_Man_t *pAig)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int v;
  
  if (pAig->pReprs == (Gia_Rpr_t *)0x0) {
    iVar3 = -1;
  }
  else {
    iVar3 = 0;
    for (v = 0; v < pAig->vCos->nSize - pAig->nRegs; v = v + 1) {
      pGVar2 = Gia_ManCo(pAig,v);
      if (pGVar2 == (Gia_Obj_t *)0x0) {
        return iVar3;
      }
      pGVar1 = pAig->pObjs;
      if ((pGVar2 < pGVar1) || (pGVar1 + pAig->nObjs <= pGVar2)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar3 = (iVar3 + 1) -
              (uint)(((uint)pAig->pReprs
                            [(int)((int)(((long)pGVar2 - (long)pGVar1) / 0xc) -
                                  (*(uint *)pGVar2 & 0x1fffffff))] & 0xfffffff) == 0);
    }
  }
  return iVar3;
}

Assistant:

int Cec_ManCountNonConstOutputs( Gia_Man_t * pAig )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    if ( pAig->pReprs == NULL )
        return -1;
    Gia_ManForEachPo( pAig, pObj, i )
        if ( !Gia_ObjIsConst( pAig, Gia_ObjFaninId0p(pAig, pObj) ) )
            Counter++;
    return Counter;
}